

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::RecordSet::SetRecordValues
          (RecordSet *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *RV,KUINT16 RecCnt)

{
  KUINT16 KVar1;
  KUINT8 i;
  byte bVar2;
  KUINT8 ui8Pad;
  value_type_conflict local_29;
  
  this->m_ui16RecCnt = RecCnt;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->m_vui8RecVals,RV);
  KVar1 = this->m_ui16RecLen;
  local_29 = '\0';
  for (bVar2 = 0; bVar2 < ((byte)KVar1 & 3); bVar2 = bVar2 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vui8RecVals,&local_29);
  }
  this->m_ui16RecLen =
       ((short)*(undefined4 *)
                &(this->m_vui8RecVals).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
       (short)*(undefined4 *)
               &(this->m_vui8RecVals).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) + this->m_ui16RecLen + 0xc;
  return;
}

Assistant:

void RecordSet::SetRecordValues( const vector<KUINT8> & RV, KUINT16 RecCnt )
{
    m_ui16RecCnt = RecCnt;
    m_vui8RecVals = RV;

    // Calculate padding to a 32 bit boundary.
    KUINT8 ui8NumPadding = m_ui16RecLen % 4;

    // Add the padding
    KUINT8 ui8Pad = 0;

    for( KUINT8 i = 0; i < ui8NumPadding; ++i )
    {
        m_vui8RecVals.push_back( ui8Pad );
    }

    m_ui16RecLen += RECORD_SET_SIZE + m_vui8RecVals.size();
}